

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

State * __thiscall re2::DFA::StateSaver::Restore(StateSaver *this)

{
  int iVar1;
  State *pSVar2;
  Mutex *__rwlock;
  LogMessage local_190;
  
  if (this->is_special_ == true) {
    return this->special_;
  }
  __rwlock = &this->dfa_->mutex_;
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar1 == 0) {
    pSVar2 = CachedState(this->dfa_,this->inst_,this->ninst_,this->flag_);
    if (pSVar2 == (State *)0x0) {
      LogMessage::LogMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x4d9
                 ,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_190.str_,"StateSaver failed to restore state.",0x23);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
    }
    iVar1 = pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    if (iVar1 == 0) {
      return pSVar2;
    }
  }
  abort();
}

Assistant:

DFA::State* DFA::StateSaver::Restore() {
  if (is_special_)
    return special_;
  MutexLock l(&dfa_->mutex_);
  State* s = dfa_->CachedState(inst_, ninst_, flag_);
  if (s == NULL)
    LOG(DFATAL) << "StateSaver failed to restore state.";
  return s;
}